

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_layout_mapping_left_basics.cpp
# Opt level: O0

void test_3d_static<15ul,30ul,15ul>(void)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  value_type vVar4;
  long lVar5;
  value_type vVar6;
  value_type vVar7;
  size_type sVar8;
  __tuple_element_t<0UL,_tuple<int,_int,_int>_> *p_Var9;
  __tuple_element_t<1UL,_tuple<int,_int,_int>_> *p_Var10;
  __tuple_element_t<2UL,_tuple<int,_int,_int>_> *p_Var11;
  long lVar12;
  tuple<int,_int,_int> *ptStack_13d10;
  tuple<int,_int,_int> *ptStack_13d08;
  tuple<int,_int,_int> *ptStack_13d00;
  size_type sStack_13cf8;
  unsigned_long uStack_13cf0;
  value_type true_idx;
  int iStack_13ce0;
  int i;
  int j;
  int k;
  tuple<int,_int,_int> dptr [6750];
  unsigned_long local_68;
  size_type local_60;
  unsigned_long local_58;
  size_type local_50;
  unsigned_long local_48;
  size_type local_40;
  unsigned_long local_38;
  size_type local_30;
  int local_24;
  size_type local_20;
  bool local_14;
  bool local_13;
  bool local_12;
  bool local_11;
  bool local_10;
  bool local_f;
  bool local_e;
  bool local_d;
  layout_mapping_regular_precomputed_strides<std::experimental::dimensions<15UL,_30UL,_15UL>,_std::experimental::dimensions<1UL,_1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL,_0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>_>
  local_c [2];
  layout_mapping_left<dimensions<15UL,_30UL,_15UL>,_dimensions<1,_1,_1>,_dimensions<0,_0,_0>_> l;
  
  std::experimental::
  layout_mapping_regular_precomputed_strides<std::experimental::dimensions<15UL,_30UL,_15UL>,_std::experimental::dimensions<1UL,_1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL,_0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>_>
  ::layout_mapping_regular_precomputed_strides(local_c);
  local_d = std::experimental::detail::
            layout_mapping_regular_base<std::experimental::dimensions<15UL,_30UL,_15UL>,_std::experimental::dimensions<1UL,_1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL,_0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>_>
            ::is_regular();
  local_e = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x106,"void test_3d_static() [X = 15UL, Y = 30UL, Z = 15UL]",&local_d,&local_e);
  local_f = std::experimental::detail::
            layout_mapping_regular_base<std::experimental::dimensions<15UL,_30UL,_15UL>,_std::experimental::dimensions<1UL,_1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL,_0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>_>
            ::is_dynamic_stride(0);
  local_10 = false;
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_dynamic_stride(0))","false",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x108,"void test_3d_static() [X = 15UL, Y = 30UL, Z = 15UL]",&local_f,&local_10);
  local_11 = std::experimental::detail::
             layout_mapping_regular_base<std::experimental::dimensions<15UL,_30UL,_15UL>,_std::experimental::dimensions<1UL,_1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL,_0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>_>
             ::is_dynamic_stride(1);
  local_12 = false;
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_dynamic_stride(1))","false",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x109,"void test_3d_static() [X = 15UL, Y = 30UL, Z = 15UL]",&local_11,&local_12);
  local_13 = std::experimental::detail::
             layout_mapping_regular_base<std::experimental::dimensions<15UL,_30UL,_15UL>,_std::experimental::dimensions<1UL,_1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL,_0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>_>
             ::is_dynamic_stride(2);
  local_14 = false;
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_dynamic_stride(2))","false",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x10a,"void test_3d_static() [X = 15UL, Y = 30UL, Z = 15UL]",&local_13,&local_14);
  local_20 = std::experimental::
             layout_mapping_regular_precomputed_strides<std::experimental::dimensions<15UL,_30UL,_15UL>,_std::experimental::dimensions<1UL,_1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL,_0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>_>
             ::stride(local_c,0);
  local_24 = 1;
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(0))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x10c,"void test_3d_static() [X = 15UL, Y = 30UL, Z = 15UL]",&local_20,&local_24);
  local_30 = std::experimental::
             layout_mapping_regular_precomputed_strides<std::experimental::dimensions<15UL,_30UL,_15UL>,_std::experimental::dimensions<1UL,_1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL,_0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>_>
             ::stride(local_c,1);
  local_38 = 0xf;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.stride(1))","X",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x10d,"void test_3d_static() [X = 15UL, Y = 30UL, Z = 15UL]",&local_30,&local_38);
  local_40 = std::experimental::
             layout_mapping_regular_precomputed_strides<std::experimental::dimensions<15UL,_30UL,_15UL>,_std::experimental::dimensions<1UL,_1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL,_0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>_>
             ::stride(local_c,2);
  local_48 = 0x1c2;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.stride(2))","X * Y",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x10e,"void test_3d_static() [X = 15UL, Y = 30UL, Z = 15UL]",&local_40,&local_48);
  local_50 = std::experimental::dimensions<15UL,_30UL,_15UL>::size
                       ((dimensions<15UL,_30UL,_15UL> *)local_c);
  local_58 = 0x1a5e;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.size())","X * Y * Z",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x110,"void test_3d_static() [X = 15UL, Y = 30UL, Z = 15UL]",&local_50,&local_58);
  local_60 = std::experimental::detail::
             layout_mapping_regular_base<std::experimental::dimensions<15UL,_30UL,_15UL>,_std::experimental::dimensions<1UL,_1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL,_0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>_>
             ::span(&local_c[0].
                     super_layout_mapping_regular_base<std::experimental::dimensions<15UL,_30UL,_15UL>,_std::experimental::dimensions<1UL,_1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL,_0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>_>
                   );
  local_68 = 0x1a5e;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.span())","X * Y * Z",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x111,"void test_3d_static() [X = 15UL, Y = 30UL, Z = 15UL]",&local_60,&local_68);
  ptStack_13d10 = (tuple<int,_int,_int> *)&j;
  do {
    std::tuple<int,_int,_int>::tuple<void,_true>(ptStack_13d10);
    ptStack_13d10 = ptStack_13d10 + 1;
  } while (ptStack_13d10 !=
           (tuple<int,_int,_int> *)
           &dptr[0x1a5d].super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int>.
            super__Head_base<1UL,_int,_false>);
  i = 0;
  while( true ) {
    uVar3 = (ulong)i;
    vVar4 = std::experimental::dimensions<15UL,_30UL,_15UL>::operator[]<int>
                      ((dimensions<15UL,_30UL,_15UL> *)local_c,2);
    if (vVar4 <= uVar3) break;
    iStack_13ce0 = 0;
    while( true ) {
      uVar3 = (ulong)iStack_13ce0;
      vVar4 = std::experimental::dimensions<15UL,_30UL,_15UL>::operator[]<int>
                        ((dimensions<15UL,_30UL,_15UL> *)local_c,1);
      if (vVar4 <= uVar3) break;
      true_idx._4_4_ = 0;
      while( true ) {
        uVar3 = (ulong)true_idx._4_4_;
        vVar4 = std::experimental::dimensions<15UL,_30UL,_15UL>::operator[]<int>
                          ((dimensions<15UL,_30UL,_15UL> *)local_c,0);
        if (vVar4 <= uVar3) break;
        lVar5 = (long)true_idx._4_4_;
        vVar4 = std::experimental::dimensions<15UL,_30UL,_15UL>::operator[]<int>
                          ((dimensions<15UL,_30UL,_15UL> *)local_c,0);
        lVar12 = (long)iStack_13ce0;
        vVar6 = std::experimental::dimensions<15UL,_30UL,_15UL>::operator[]<int>
                          ((dimensions<15UL,_30UL,_15UL> *)local_c,0);
        vVar7 = std::experimental::dimensions<15UL,_30UL,_15UL>::operator[]<int>
                          ((dimensions<15UL,_30UL,_15UL> *)local_c,1);
        uStack_13cf0 = lVar5 + vVar4 * lVar12 + vVar6 * vVar7 * (long)i;
        sStack_13cf8 = std::experimental::
                       layout_mapping_regular_precomputed_strides<std::experimental::dimensions<15ul,30ul,15ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul,2ul>>
                       ::index<int,int,int>
                                 ((layout_mapping_regular_precomputed_strides<std::experimental::dimensions<15ul,30ul,15ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul,2ul>>
                                   *)local_c,true_idx._4_4_,iStack_13ce0,i);
        boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                  ("(l.index(i, j, k))","true_idx",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
                   ,0x11c,"void test_3d_static() [X = 15UL, Y = 30UL, Z = 15UL]",&sStack_13cf8,
                   &uStack_13cf0);
        sVar8 = std::experimental::
                layout_mapping_regular_precomputed_strides<std::experimental::dimensions<15ul,30ul,15ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul,2ul>>
                ::index<int,int,int>
                          ((layout_mapping_regular_precomputed_strides<std::experimental::dimensions<15ul,30ul,15ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul,2ul>>
                            *)local_c,true_idx._4_4_,iStack_13ce0,i);
        ptStack_13d00 = (tuple<int,_int,_int> *)(&j + sVar8 * 3);
        ptStack_13d08 = (tuple<int,_int,_int> *)(&j + uStack_13cf0 * 3);
        boost::detail::test_eq_impl<std::tuple<int,int,int>*,std::tuple<int,int,int>*>
                  ("&(dptr[l.index(i, j, k)])","&(dptr[true_idx])",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
                   ,0x11e,"void test_3d_static() [X = 15UL, Y = 30UL, Z = 15UL]",&ptStack_13d00,
                   &ptStack_13d08);
        iVar1 = true_idx._4_4_;
        sVar8 = std::experimental::
                layout_mapping_regular_precomputed_strides<std::experimental::dimensions<15ul,30ul,15ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul,2ul>>
                ::index<int,int,int>
                          ((layout_mapping_regular_precomputed_strides<std::experimental::dimensions<15ul,30ul,15ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul,2ul>>
                            *)local_c,true_idx._4_4_,iStack_13ce0,i);
        p_Var9 = std::get<0ul,int,int,int>((tuple<int,_int,_int> *)(&j + sVar8 * 3));
        iVar2 = iStack_13ce0;
        *p_Var9 = iVar1;
        sVar8 = std::experimental::
                layout_mapping_regular_precomputed_strides<std::experimental::dimensions<15ul,30ul,15ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul,2ul>>
                ::index<int,int,int>
                          ((layout_mapping_regular_precomputed_strides<std::experimental::dimensions<15ul,30ul,15ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul,2ul>>
                            *)local_c,true_idx._4_4_,iStack_13ce0,i);
        p_Var10 = std::get<1ul,int,int,int>((tuple<int,_int,_int> *)(&j + sVar8 * 3));
        iVar1 = i;
        *p_Var10 = iVar2;
        sVar8 = std::experimental::
                layout_mapping_regular_precomputed_strides<std::experimental::dimensions<15ul,30ul,15ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul,2ul>>
                ::index<int,int,int>
                          ((layout_mapping_regular_precomputed_strides<std::experimental::dimensions<15ul,30ul,15ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul,2ul>>
                            *)local_c,true_idx._4_4_,iStack_13ce0,i);
        p_Var11 = std::get<2ul,int,int,int>((tuple<int,_int,_int> *)(&j + sVar8 * 3));
        *p_Var11 = iVar1;
        sVar8 = std::experimental::
                layout_mapping_regular_precomputed_strides<std::experimental::dimensions<15ul,30ul,15ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul,2ul>>
                ::index<int,int,int>
                          ((layout_mapping_regular_precomputed_strides<std::experimental::dimensions<15ul,30ul,15ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul,2ul>>
                            *)local_c,true_idx._4_4_,iStack_13ce0,i);
        p_Var9 = std::get<0ul,int,int,int>((tuple<int,_int,_int> *)(&j + sVar8 * 3));
        boost::detail::test_eq_impl<int,int>
                  ("(std::get<0>(dptr[l.index(i, j, k)]))","i",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
                   ,0x124,"void test_3d_static() [X = 15UL, Y = 30UL, Z = 15UL]",p_Var9,
                   (int *)((long)&true_idx + 4));
        sVar8 = std::experimental::
                layout_mapping_regular_precomputed_strides<std::experimental::dimensions<15ul,30ul,15ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul,2ul>>
                ::index<int,int,int>
                          ((layout_mapping_regular_precomputed_strides<std::experimental::dimensions<15ul,30ul,15ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul,2ul>>
                            *)local_c,true_idx._4_4_,iStack_13ce0,i);
        p_Var10 = std::get<1ul,int,int,int>((tuple<int,_int,_int> *)(&j + sVar8 * 3));
        boost::detail::test_eq_impl<int,int>
                  ("(std::get<1>(dptr[l.index(i, j, k)]))","j",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
                   ,0x125,"void test_3d_static() [X = 15UL, Y = 30UL, Z = 15UL]",p_Var10,
                   &iStack_13ce0);
        sVar8 = std::experimental::
                layout_mapping_regular_precomputed_strides<std::experimental::dimensions<15ul,30ul,15ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul,2ul>>
                ::index<int,int,int>
                          ((layout_mapping_regular_precomputed_strides<std::experimental::dimensions<15ul,30ul,15ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul,2ul>>
                            *)local_c,true_idx._4_4_,iStack_13ce0,i);
        p_Var11 = std::get<2ul,int,int,int>((tuple<int,_int,_int> *)(&j + sVar8 * 3));
        boost::detail::test_eq_impl<int,int>
                  ("(std::get<2>(dptr[l.index(i, j, k)]))","k",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
                   ,0x126,"void test_3d_static() [X = 15UL, Y = 30UL, Z = 15UL]",p_Var11,&i);
        true_idx._4_4_ = true_idx._4_4_ + 1;
      }
      iStack_13ce0 = iStack_13ce0 + 1;
    }
    i = i + 1;
  }
  return;
}

Assistant:

void test_3d_static()
{ // {{{
    layout_mapping_left<
        dimensions<X, Y, Z>, dimensions<1, 1, 1>, dimensions<0, 0, 0>
    >  const l{};

    BOOST_TEST_EQ((l.is_regular()), true);

    BOOST_TEST_EQ((l.is_dynamic_stride(0)), false);
    BOOST_TEST_EQ((l.is_dynamic_stride(1)), false);
    BOOST_TEST_EQ((l.is_dynamic_stride(2)), false);

    BOOST_TEST_EQ((l.stride(0)), 1);
    BOOST_TEST_EQ((l.stride(1)), X);
    BOOST_TEST_EQ((l.stride(2)), X * Y);

    BOOST_TEST_EQ((l.size()), X * Y * Z);
    BOOST_TEST_EQ((l.span()), X * Y * Z);

    tuple<int, int, int> dptr[X * Y * Z];

    // Set all elements to a unique value.
    for (auto k = 0; k < l[2]; ++k)
    for (auto j = 0; j < l[1]; ++j)
    for (auto i = 0; i < l[0]; ++i)
    {
        auto const true_idx = (i) + (l[0]) * (j) + (l[0]) * (l[1]) * (k);

        BOOST_TEST_EQ((l.index(i, j, k)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j, k)]), &(dptr[true_idx])); 

        std::get<0>(dptr[l.index(i, j, k)]) = i;
        std::get<1>(dptr[l.index(i, j, k)]) = j;
        std::get<2>(dptr[l.index(i, j, k)]) = k;

        BOOST_TEST_EQ((std::get<0>(dptr[l.index(i, j, k)])), i); 
        BOOST_TEST_EQ((std::get<1>(dptr[l.index(i, j, k)])), j); 
        BOOST_TEST_EQ((std::get<2>(dptr[l.index(i, j, k)])), k); 
    }
}